

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3NodeFree(SegmentNode *pTree)

{
  SegmentNode *pSVar1;
  SegmentNode *p;
  
  if (pTree != (SegmentNode *)0x0) {
    p = pTree->pLeftmost;
    fts3NodeFree(p->pParent);
    while (p != (SegmentNode *)0x0) {
      pSVar1 = p->pRight;
      if ((SegmentNode *)p->aData != p + 1) {
        sqlite3_free((SegmentNode *)p->aData);
      }
      sqlite3_free(p->zMalloc);
      sqlite3_free(p);
      p = pSVar1;
    }
  }
  return;
}

Assistant:

static void fts3NodeFree(SegmentNode *pTree){
  if( pTree ){
    SegmentNode *p = pTree->pLeftmost;
    fts3NodeFree(p->pParent);
    while( p ){
      SegmentNode *pRight = p->pRight;
      if( p->aData!=(char *)&p[1] ){
        sqlite3_free(p->aData);
      }
      assert( pRight==0 || p->zMalloc==0 );
      sqlite3_free(p->zMalloc);
      sqlite3_free(p);
      p = pRight;
    }
  }
}